

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.hpp
# Opt level: O0

void __thiscall helics::FederateState::unlock(FederateState *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(seq_cst,__memory_order_mask);
  LOCK();
  *(undefined1 *)(in_RDI + 0x520) = 0;
  UNLOCK();
  return;
}

Assistant:

void unlock() const { processing.clear(); }